

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceObjectArchive::Serialize(DeviceObjectArchive *this,IDataBlob **ppDataBlob)

{
  SerializedData *this_00;
  bool bVar1;
  Char *pCVar2;
  size_t sVar3;
  DataBlobImpl *pDVar4;
  void *pData;
  char (*in_RCX) [17];
  undefined1 local_e8 [8];
  string msg_2;
  undefined1 local_a8 [8];
  Serializer<(Diligent::SerializerMode)1> Writer;
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  Serializer<(Diligent::SerializerMode)2> Measurer;
  anon_class_8_1_8991fb9c SerializeThis;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  IDataBlob **ppDataBlob_local;
  DeviceObjectArchive *this_local;
  
  msg.field_2._8_8_ = ppDataBlob;
  if (ppDataBlob == (IDataBlob **)0x0) {
    FormatString<char[49]>
              ((string *)local_38,(char (*) [49])"Pointer to the data blob object must not be null")
    ;
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0xf3);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    if (*ppDataBlob != (IDataBlob *)0x0) {
      FormatString<char[30]>
                ((string *)&SerializeThis,(char (*) [30])"Data blob object must be null");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [17])0xf6;
      DebugAssertionFailed
                (pCVar2,"Serialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0xf6);
      std::__cxx11::string::~string((string *)&SerializeThis);
    }
    Measurer.m_Ptr = (TPointer)this;
    Serializer<(Diligent::SerializerMode)2>::Serializer
              ((Serializer<(Diligent::SerializerMode)2> *)&pDataBlob);
    const::$_0::operator()
              ((__0 *)&Measurer.m_Ptr,(Serializer<(Diligent::SerializerMode)2> *)&pDataBlob);
    sVar3 = Serializer<(Diligent::SerializerMode)2>::GetSize
                      ((Serializer<(Diligent::SerializerMode)2> *)&pDataBlob);
    DataBlobImpl::Create((DataBlobImpl *)&Writer.m_Ptr,sVar3,(void *)0x0);
    pDVar4 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&Writer.m_Ptr);
    pData = DataBlobImpl::GetDataPtr(pDVar4,0);
    pDVar4 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&Writer.m_Ptr);
    sVar3 = DataBlobImpl::GetSize(pDVar4);
    this_00 = (SerializedData *)((long)&msg_2.field_2 + 8);
    SerializedData::SerializedData(this_00,pData,sVar3);
    Serializer<(Diligent::SerializerMode)1>::Serializer
              ((Serializer<(Diligent::SerializerMode)1> *)local_a8,this_00);
    SerializedData::~SerializedData((SerializedData *)((long)&msg_2.field_2 + 8));
    const::$_0::operator()
              ((__0 *)&Measurer.m_Ptr,(Serializer<(Diligent::SerializerMode)1> *)local_a8);
    bVar1 = Serializer<(Diligent::SerializerMode)1>::IsEnded
                      ((Serializer<(Diligent::SerializerMode)1> *)local_a8);
    if (!bVar1) {
      FormatString<char[26],char[17]>
                ((string *)local_e8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Writer.IsEnded()",in_RCX);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"Serialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x120);
      std::__cxx11::string::~string((string *)local_e8);
    }
    pDVar4 = RefCntAutoPtr<Diligent::DataBlobImpl>::Detach
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&Writer.m_Ptr);
    *(DataBlobImpl **)msg.field_2._8_8_ = pDVar4;
    RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&Writer.m_Ptr);
  }
  return;
}

Assistant:

void DeviceObjectArchive::Serialize(IDataBlob** ppDataBlob) const
{
    if (ppDataBlob == nullptr)
    {
        DEV_ERROR("Pointer to the data blob object must not be null");
        return;
    }
    DEV_CHECK_ERR(*ppDataBlob == nullptr, "Data blob object must be null");

    auto SerializeThis = [this](auto& Ser) {
        constexpr auto SerMode    = std::remove_reference<decltype(Ser)>::type::GetMode();
        const auto     ArchiveSer = ArchiveSerializer<SerMode>{Ser};

        ArchiveHeader Header;
        Header.ContentVersion = m_ContentVersion;

        auto res = ArchiveSer.SerializeHeader(Header);
        VERIFY(res, "Failed to serialize header");

        Uint32 NumResources = StaticCast<Uint32>(m_NamedResources.size());
        res                 = Ser(NumResources);
        VERIFY(res, "Failed to serialize the number of resources");

        for (const auto& res_it : m_NamedResources)
        {
            const auto* Name    = res_it.first.GetName();
            const auto  ResType = res_it.first.GetType();

            res = Ser(ResType, Name);
            VERIFY(res, "Failed to serialize resource type and name");

            res = ArchiveSer.SerializeResourceData(res_it.second);
            VERIFY(res, "Failed to serialize resource data");
        }

        for (auto& Shaders : m_DeviceShaders)
        {
            res = ArchiveSer.SerializeShaders(Shaders);
            VERIFY(res, "Failed to serialize shaders");
        }
    };

    Serializer<SerializerMode::Measure> Measurer;
    SerializeThis(Measurer);

    auto pDataBlob = DataBlobImpl::Create(Measurer.GetSize());

    Serializer<SerializerMode::Write> Writer{SerializedData{pDataBlob->GetDataPtr(), pDataBlob->GetSize()}};
    SerializeThis(Writer);
    VERIFY_EXPR(Writer.IsEnded());

    *ppDataBlob = pDataBlob.Detach();
}